

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# perfetto.cc
# Opt level: O0

void __thiscall
perfetto::protos::gen::AndroidPowerConfig::Serialize(AndroidPowerConfig *this,Message *msg)

{
  bool bVar1;
  reference pAVar2;
  void *data;
  size_t size;
  AndroidPowerConfig_BatteryCounters *it;
  const_iterator __end2;
  const_iterator __begin2;
  vector<perfetto::protos::gen::AndroidPowerConfig_BatteryCounters,_std::allocator<perfetto::protos::gen::AndroidPowerConfig_BatteryCounters>_>
  *__range2;
  Message *msg_local;
  AndroidPowerConfig *this_local;
  
  bVar1 = std::bitset<5UL>::operator[](&this->_has_field_,1);
  if (bVar1) {
    protozero::Message::AppendVarInt<unsigned_int>(msg,1,this->battery_poll_ms_);
  }
  __end2 = std::
           vector<perfetto::protos::gen::AndroidPowerConfig_BatteryCounters,_std::allocator<perfetto::protos::gen::AndroidPowerConfig_BatteryCounters>_>
           ::begin(&this->battery_counters_);
  it = (AndroidPowerConfig_BatteryCounters *)
       std::
       vector<perfetto::protos::gen::AndroidPowerConfig_BatteryCounters,_std::allocator<perfetto::protos::gen::AndroidPowerConfig_BatteryCounters>_>
       ::end(&this->battery_counters_);
  while (bVar1 = __gnu_cxx::operator!=
                           (&__end2,(__normal_iterator<const_perfetto::protos::gen::AndroidPowerConfig_BatteryCounters_*,_std::vector<perfetto::protos::gen::AndroidPowerConfig_BatteryCounters,_std::allocator<perfetto::protos::gen::AndroidPowerConfig_BatteryCounters>_>_>
                                     *)&it), bVar1) {
    pAVar2 = __gnu_cxx::
             __normal_iterator<const_perfetto::protos::gen::AndroidPowerConfig_BatteryCounters_*,_std::vector<perfetto::protos::gen::AndroidPowerConfig_BatteryCounters,_std::allocator<perfetto::protos::gen::AndroidPowerConfig_BatteryCounters>_>_>
             ::operator*(&__end2);
    protozero::Message::AppendVarInt<perfetto::protos::gen::AndroidPowerConfig_BatteryCounters>
              (msg,2,*pAVar2);
    __gnu_cxx::
    __normal_iterator<const_perfetto::protos::gen::AndroidPowerConfig_BatteryCounters_*,_std::vector<perfetto::protos::gen::AndroidPowerConfig_BatteryCounters,_std::allocator<perfetto::protos::gen::AndroidPowerConfig_BatteryCounters>_>_>
    ::operator++(&__end2);
  }
  bVar1 = std::bitset<5UL>::operator[](&this->_has_field_,3);
  if (bVar1) {
    protozero::Message::AppendTinyVarInt(msg,3,(uint)(this->collect_power_rails_ & 1));
  }
  bVar1 = std::bitset<5UL>::operator[](&this->_has_field_,4);
  if (bVar1) {
    protozero::Message::AppendTinyVarInt
              (msg,4,(uint)(this->collect_energy_estimation_breakdown_ & 1));
  }
  data = (void *)::std::__cxx11::string::data();
  size = ::std::__cxx11::string::size();
  protozero::Message::AppendRawProtoBytes(msg,data,size);
  return;
}

Assistant:

void AndroidPowerConfig::Serialize(::protozero::Message* msg) const {
  // Field 1: battery_poll_ms
  if (_has_field_[1]) {
    msg->AppendVarInt(1, battery_poll_ms_);
  }

  // Field 2: battery_counters
  for (auto& it : battery_counters_) {
    msg->AppendVarInt(2, it);
  }

  // Field 3: collect_power_rails
  if (_has_field_[3]) {
    msg->AppendTinyVarInt(3, collect_power_rails_);
  }

  // Field 4: collect_energy_estimation_breakdown
  if (_has_field_[4]) {
    msg->AppendTinyVarInt(4, collect_energy_estimation_breakdown_);
  }

  msg->AppendRawProtoBytes(unknown_fields_.data(), unknown_fields_.size());
}